

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

Abc_Obj_t * Abc_NtkAreaOptOne(Sfm_Dec_t *p,int i)

{
  Abc_Ntk_t *pNtk_00;
  Sfm_Par_t *pPars_00;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  abctime aVar3;
  abctime aVar4;
  int local_68;
  int i_1;
  int Var;
  int RetValue;
  int Limit;
  Abc_Obj_t *pObj;
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  abctime clk;
  int i_local;
  Sfm_Dec_t *p_local;
  
  pNtk_00 = p->pNtk;
  pPars_00 = p->pPars;
  pNode = Abc_NtkObj(p->pNtk,i);
  if ((pPars_00->nMffcMin < 2) ||
     (iVar1 = Abc_NodeMffcLabel(pNode,(Vec_Ptr_t *)0x0), pPars_00->nMffcMin <= iVar1)) {
    if ((pPars_00->iNodeOne == 0) || (i == pPars_00->iNodeOne)) {
      if (pPars_00->iNodeOne != 0) {
        pPars_00->fVeryVerbose = (uint)(i == pPars_00->iNodeOne);
      }
      p->nNodesTried = p->nNodesTried + 1;
      aVar3 = Abc_Clock();
      iVar1 = Sfm_DecExtract(pNtk_00,pPars_00,pNode,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                             &p->vObjMap,&p->vGateTfi,&p->vGateTfo,&p->vObjMffc,&p->vObjInMffc,
                             (Sfm_Tim_t *)0x0,(Sfm_Mit_t *)0x0);
      p->nDivs = iVar1;
      aVar4 = Abc_Clock();
      p->timeWin = (aVar4 - aVar3) + p->timeWin;
      if ((pPars_00->nWinSizeMax == 0) ||
         (iVar1 = pPars_00->nWinSizeMax, iVar2 = Vec_IntSize(&p->vObjGates), iVar2 <= iVar1)) {
        iVar1 = Vec_IntSize(&p->vObjMffc);
        p->nMffc = iVar1;
        iVar1 = Sfm_DecMffcArea(pNtk_00,&p->vObjMffc);
        p->AreaMffc = iVar1;
        iVar1 = Abc_MaxInt(p->nMaxDivs,p->nDivs);
        p->nMaxDivs = iVar1;
        p->nAllDivs = (long)p->nDivs + p->nAllDivs;
        p->iTarget = (pNode->field_6).iTemp;
        iVar1 = Vec_IntSize(&p->vObjGates);
        iVar2 = Abc_MaxInt(p->nMaxWin,iVar1);
        p->nMaxWin = iVar2;
        p->nAllWin = (long)iVar1 + p->nAllWin;
        aVar3 = Abc_Clock();
        iVar2 = Sfm_DecPrepareSolver(p);
        aVar4 = Abc_Clock();
        p->timeCnf = (aVar4 - aVar3) + p->timeCnf;
        if (iVar2 == 0) {
          p_local = (Sfm_Dec_t *)0x0;
        }
        else {
          aVar3 = Abc_Clock();
          i_1 = Sfm_DecPeformDec2(p,pNode);
          if ((pPars_00->fMoreEffort != 0) && (i_1 < 0)) {
            local_68 = Vec_IntSize(&p->vObjInMffc);
            do {
              local_68 = local_68 + -1;
              if (local_68 < 0) goto LAB_00661d05;
              iVar2 = Vec_IntEntry(&p->vObjInMffc,local_68);
              p->iUseThis = iVar2;
              i_1 = Sfm_DecPeformDec2(p,pNode);
              p->iUseThis = -1;
            } while (i_1 < 0);
            p->nEfforts = p->nEfforts + 1;
          }
LAB_00661d05:
          if (p->pPars->fVeryVerbose != 0) {
            printf("\n\n");
          }
          aVar4 = Abc_Clock();
          p->timeSat = (aVar4 - aVar3) + p->timeSat;
          if (i_1 < 0) {
            p_local = (Sfm_Dec_t *)0x0;
          }
          else {
            p->nNodesChanged = p->nNodesChanged + 1;
            Abc_NtkCountStats(p,iVar1);
            p_local = (Sfm_Dec_t *)
                      Sfm_DecInsert(pNtk_00,pNode,iVar1,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                                    &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,
                                    (Vec_Int_t *)0x0,p->pMit);
          }
        }
      }
      else {
        p_local = (Sfm_Dec_t *)0x0;
      }
    }
    else {
      p_local = (Sfm_Dec_t *)0x0;
    }
  }
  else {
    p_local = (Sfm_Dec_t *)0x0;
  }
  return (Abc_Obj_t *)p_local;
}

Assistant:

Abc_Obj_t * Abc_NtkAreaOptOne( Sfm_Dec_t * p, int i )
{
    abctime clk;
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars;
    Abc_Obj_t * pObj = Abc_NtkObj( p->pNtk, i ); 
    int Limit, RetValue;
    if ( pPars->nMffcMin > 1 && Abc_NodeMffcLabel(pObj, NULL) < pPars->nMffcMin )
        return NULL;
    if ( pPars->iNodeOne && i != pPars->iNodeOne )
        return NULL;
    if ( pPars->iNodeOne )
        pPars->fVeryVerbose = (int)(i == pPars->iNodeOne);
    p->nNodesTried++;
clk = Abc_Clock();
    p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateTfi, &p->vGateTfo, &p->vObjMffc, &p->vObjInMffc, NULL, NULL );
p->timeWin += Abc_Clock() - clk;
    if ( pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates) )
        return NULL;
    p->nMffc = Vec_IntSize(&p->vObjMffc);
    p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
    p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
    p->nAllDivs += p->nDivs;
    p->iTarget = pObj->iTemp;
    Limit = Vec_IntSize( &p->vObjGates );
    p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
    p->nAllWin += Limit;
clk = Abc_Clock();
    RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
    if ( !RetValue )
        return NULL;
clk = Abc_Clock();
    RetValue = Sfm_DecPeformDec2( p, pObj );
    if ( pPars->fMoreEffort && RetValue < 0 )
    {
        int Var, i;
        Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
        {
            p->iUseThis = Var; 
            RetValue = Sfm_DecPeformDec2( p, pObj );
            p->iUseThis = -1;
            if ( RetValue < 0 )
            {
                //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
            }
            else
            {
                p->nEfforts++;
                if ( p->pPars->fVerbose )
                {
                    //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                    //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                }
                break;
            }
        }
    }
    if ( p->pPars->fVeryVerbose )
        printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue < 0 )
        return NULL;
    p->nNodesChanged++;
    Abc_NtkCountStats( p, Limit );
    return Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, NULL, p->pMit );
}